

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

int Curl_strcasecompare(char *first,char *second)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char *local_20;
  char *second_local;
  char *first_local;
  
  local_20 = second;
  second_local = first;
  while( true ) {
    bVar3 = false;
    if (*second_local != '\0') {
      bVar3 = *local_20 != '\0';
    }
    if (!bVar3) break;
    cVar1 = Curl_raw_toupper(*second_local);
    cVar2 = Curl_raw_toupper(*local_20);
    if (cVar1 != cVar2) {
      return 0;
    }
    second_local = second_local + 1;
    local_20 = local_20 + 1;
  }
  return (uint)((*second_local == '\0') == (*local_20 == '\0'));
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      return 0;
    first++;
    second++;
  }
  /* If we're here either the strings are the same or the length is different.
     We can just test if the "current" character is non-zero for one and zero
     for the other. Note that the characters may not be exactly the same even
     if they match, we only want to compare zero-ness. */
  return !*first == !*second;
}